

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

float_t __thiscall djb::tab::ndf_std(tab *this,vec3 *wm)

{
  int s1;
  int s2;
  float_t fVar1;
  double dVar2;
  float local_44;
  float_t u2;
  float_t u1;
  float_t pm;
  int h;
  int w;
  vec3 *wm_local;
  tab *this_local;
  
  if (wm->z < 0.0) {
    this_local._4_4_ = 0.0;
  }
  else {
    s1 = this->m_zres;
    s2 = this->m_pres;
    if (1.0 < wm->z || wm->z == 1.0) {
      local_44 = 0.0;
    }
    else {
      dVar2 = std::atan2((double)(ulong)(uint)wm->y,(double)(ulong)(uint)wm->x);
      local_44 = SUB84(dVar2,0);
    }
    dVar2 = std::acos((double)(ulong)(uint)wm->z);
    fVar1 = m_pi();
    dVar2 = std::sqrt((double)(ulong)(uint)(SUB84(dVar2,0) * (2.0 / fVar1)));
    fVar1 = m_pi();
    this_local._4_4_ =
         spline::eval2d<float>
                   (&this->m_ndf,s1,s2,spline::uwrap_edge,SUB84(dVar2,0),spline::uwrap_repeat,
                    (local_44 / fVar1 + 1.0) / 2.0);
  }
  return this_local._4_4_;
}

Assistant:

float_t tab::ndf_std(const vec3 &wm) const
{
	if (wm.z >= 0) {
		int w = m_zres;
		int h = m_pres;
		float_t pm = wm.z < 1 ? atan2(wm.y, wm.x) : 0;
		float_t u1 = sqrt(acos(wm.z) * (2 / m_pi()));
		float_t u2 = (pm / m_pi() + 1) / 2;

		return spline::eval2d(m_ndf, w, h,
		                      spline::uwrap_edge  , u1,
		                      spline::uwrap_repeat, u2);
	}
	return 0;
}